

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O1

void __thiscall
BMRS<UF>::FindRunsMem
          (BMRS<UF> *this,uint64_t *bits_start,uint64_t *bits_flag,int height,int data_width,
          Run *runs)

{
  ulong *puVar1;
  ushort uVar2;
  uint uVar3;
  pointer puVar4;
  pointer piVar5;
  uint uVar6;
  uint uVar7;
  ulong *puVar8;
  long lVar9;
  long lVar10;
  short sVar11;
  ushort uVar12;
  long lVar13;
  Run *pRVar14;
  ulong uVar15;
  ushort uVar16;
  unsigned_short uVar17;
  short sVar18;
  uint64_t *puVar19;
  ulong uVar20;
  uint64_t uVar21;
  long lVar22;
  ulong *puVar23;
  long lVar24;
  Run *pRVar25;
  uint local_98;
  Run *local_90;
  
  piVar5 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = (long)data_width;
  uVar21 = *bits_start;
  sVar18 = 0;
  puVar19 = bits_start;
  local_90 = runs;
  do {
    lVar13 = 0;
    if (uVar21 != 0) {
      for (; (uVar21 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
      }
    }
    sVar11 = (short)lVar13;
    if (uVar21 == 0) {
      do {
        puVar19 = puVar19 + 1;
        if (puVar19 == bits_start + lVar10) {
          local_90->start_pos = 0xffff;
          local_90->end_pos = 0xffff;
          if (height < 2) {
LAB_0022e112:
            uVar7 = UF::MemFlatten();
            (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar7;
            return;
          }
          uVar20 = 1;
LAB_0022dda9:
          pRVar14 = local_90 + 1;
          puVar19 = bits_flag + (uVar20 - 1) * lVar10;
          puVar23 = bits_start + uVar20 * lVar10;
          puVar8 = puVar23 + lVar10;
          uVar15 = *puVar23;
          lVar13 = 0;
          local_90 = pRVar14;
          do {
            lVar9 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
              }
            }
            lVar22 = lVar13;
            if (uVar15 == 0) {
              do {
                puVar23 = puVar23 + 1;
                if (puVar23 == puVar8) {
                  local_90->start_pos = 0xffff;
                  local_90->end_pos = 0xffff;
                  uVar20 = uVar20 + 1;
                  runs = pRVar14;
                  if (uVar20 != (uint)height) goto LAB_0022dda9;
                  goto LAB_0022e112;
                }
                lVar22 = lVar13 + 0x40;
                uVar15 = *puVar23;
                lVar9 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                  }
                }
                lVar13 = lVar22;
              } while (uVar15 == 0);
            }
            uVar15 = (~uVar15 >> ((byte)lVar9 & 0x3f)) << ((byte)lVar9 & 0x3f);
            lVar24 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
              }
            }
            lVar13 = lVar22;
            if (uVar15 == 0) {
              do {
                lVar13 = lVar13 + 0x40;
                puVar1 = puVar23 + 1;
                puVar23 = puVar23 + 1;
                uVar15 = ~*puVar1;
                lVar24 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                  }
                }
              } while (*puVar1 == 0xffffffffffffffff);
            }
            uVar16 = (ushort)(lVar9 + lVar22);
            uVar7 = (uint)(lVar9 + lVar22) & 0xffff;
            pRVar25 = runs;
            do {
              runs = pRVar25;
              uVar2 = runs->end_pos;
              pRVar25 = runs + 1;
            } while (uVar2 < uVar7);
            uVar12 = runs->start_pos;
            uVar17 = (unsigned_short)(lVar24 + lVar13);
            local_98 = (uint)(lVar24 + lVar13);
            uVar6 = local_98 & 0xffff;
            if (uVar6 < uVar12) {
              local_90->start_pos = uVar16;
              local_90->end_pos = uVar17;
              uVar7 = UF::length_;
              lVar9 = (long)(int)UF::length_;
              UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9] =
                   UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9] + 1;
              UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar9] = uVar7;
              uVar7 = UF::length_ + 1;
              local_90->label = UF::length_;
              UF::length_ = uVar7;
            }
            else {
              if (uVar12 <= uVar7) {
                uVar12 = uVar16;
              }
              if (uVar2 < uVar6) {
                local_98 = local_98 & 0xffff;
                uVar21 = is_connected(this,puVar19,(uint)uVar12,(uint)uVar2);
                if (uVar21 == 0) {
                  uVar7 = 0;
                }
                else {
                  uVar7 = runs->label;
                  UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar7] =
                       UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar7] + 1;
                  uVar7 = UF::mem_P_.vec_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)uVar7];
                }
                uVar2 = pRVar25->start_pos;
                runs = pRVar25;
                while (uVar6 = uVar7, uVar2 <= local_98) {
                  if (local_98 <= runs->end_pos) {
                    uVar21 = is_connected(this,puVar19,(uint)uVar2,local_98);
                    if (uVar21 != 0) {
                      uVar3 = runs->label;
                      UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)uVar3] =
                           UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[(int)uVar3] + 1;
                      uVar3 = UF::mem_P_.vec_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[(int)uVar3];
                      if ((uVar7 != uVar3) && (uVar6 = uVar3, uVar7 != 0)) {
                        uVar6 = UF::MemMerge(uVar7,uVar3);
                      }
                    }
                    break;
                  }
                  uVar21 = is_connected(this,puVar19,(uint)uVar2,(uint)runs->end_pos);
                  if (uVar21 != 0) {
                    uVar3 = runs->label;
                    UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar3] =
                         UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar3] + 1;
                    uVar3 = UF::mem_P_.vec_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[(int)uVar3];
                    if ((uVar7 != uVar3) && (uVar6 = uVar3, uVar7 != 0)) {
                      uVar6 = UF::MemMerge(uVar7,uVar3);
                    }
                  }
                  pRVar25 = runs + 1;
                  runs = runs + 1;
                  uVar7 = uVar6;
                  uVar2 = pRVar25->start_pos;
                }
                uVar7 = UF::length_;
                if (uVar6 == 0) {
                  lVar9 = (long)(int)UF::length_;
                  UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar9] =
                       UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar9] + 1;
                  UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar9] = uVar7;
                  uVar6 = UF::length_;
                  UF::length_ = UF::length_ + 1;
                }
                local_90->label = uVar6;
              }
              else {
                uVar21 = is_connected(this,puVar19,(uint)uVar12,uVar6);
                uVar7 = UF::length_;
                if (uVar21 == 0) {
                  lVar9 = (long)(int)UF::length_;
                  UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar9] =
                       UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar9] + 1;
                  UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar9] = uVar7;
                  uVar7 = UF::length_;
                  UF::length_ = UF::length_ + 1;
                }
                else {
                  uVar7 = runs->label;
                  UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar7] =
                       UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar7] + 1;
                  uVar7 = UF::mem_P_.vec_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)uVar7];
                }
                local_90->label = uVar7;
              }
              local_90->start_pos = uVar16;
              local_90->end_pos = uVar17;
            }
            uVar15 = ~uVar15 & -1L << ((byte)lVar24 & 0x3f);
            local_90 = local_90 + 1;
          } while( true );
        }
        sVar18 = sVar18 + 0x40;
        uVar21 = *puVar19;
        lVar13 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        sVar11 = (short)lVar13;
      } while (uVar21 == 0);
    }
    uVar20 = (~uVar21 >> ((byte)sVar11 & 0x3f)) << ((byte)sVar11 & 0x3f);
    local_90->start_pos = sVar11 + sVar18;
    lVar13 = 0;
    if (uVar20 != 0) {
      for (; (uVar20 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
      }
    }
    sVar11 = (short)lVar13;
    if (uVar20 == 0) {
      do {
        sVar18 = sVar18 + 0x40;
        puVar23 = puVar19 + 1;
        puVar19 = puVar19 + 1;
        uVar20 = ~*puVar23;
        lVar13 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        sVar11 = (short)lVar13;
      } while (*puVar23 == 0xffffffffffffffff);
    }
    uVar21 = (~uVar20 >> ((byte)sVar11 & 0x3f)) << ((byte)sVar11 & 0x3f);
    local_90->end_pos = sVar11 + sVar18;
    uVar7 = UF::length_;
    lVar13 = (long)(int)UF::length_;
    piVar5[lVar13] = piVar5[lVar13] + 1;
    puVar4[lVar13] = uVar7;
    uVar7 = UF::length_ + 1;
    local_90->label = UF::length_;
    UF::length_ = uVar7;
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

void FindRunsMem(const uint64_t* bits_start, const uint64_t* bits_flag, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first merged row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::MemNewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits_f = bits_flag + data_width * (row - 1);
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;

            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this slice starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::MemNewLabel();
                    continue;
                };

                //Next upper run can not meet this
                unsigned short cross_st = (start_pos >= runs_up->start_pos) ? start_pos : runs_up->start_pos;
                if (end_pos <= runs_up->end_pos) {
                    if (is_connected(bits_f, cross_st, end_pos)) runs->label = LabelsSolver::MemGetLabel(runs_up->label);
                    else runs->label = LabelsSolver::MemNewLabel();
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    continue;
                }

                unsigned label;
                if (is_connected(bits_f, cross_st, runs_up->end_pos)) label = LabelsSolver::MemGetLabel(runs_up->label);
                else label = 0;
                runs_up++;

                //Find next upper runs meet this
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    if (end_pos <= runs_up->end_pos) {
                        if (is_connected(bits_f, runs_up->start_pos, end_pos)) {
                            unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::MemMerge(label, label_other) : label_other;
                            }
                        }
                        break;
                    }
                    else {
                        if (is_connected(bits_f, runs_up->start_pos, runs_up->end_pos)) {
                            unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::MemMerge(label, label_other) : label_other;
                            }
                        }
                    }
                }

                if (label) runs->label = label;
                else runs->label = LabelsSolver::MemNewLabel();
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
            }
        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::MemFlatten();
    }